

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O1

uint pseudo_median<unsigned_int>(uchar **strings,size_t N,size_t depth)

{
  byte bVar1;
  char cVar2;
  uchar *puVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  puVar3 = *strings;
  if (N < 0x1f) {
    if (puVar3 != (uchar *)0x0) {
      if (puVar3[depth] == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (uint)puVar3[depth] << 0x18;
        if (puVar3[depth + 1] != 0) {
          uVar8 = uVar8 | (uint)puVar3[depth + 1] << 0x10;
          if (puVar3[depth + 2] != '\0') {
            uVar8 = uVar8 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
          }
        }
      }
      lVar4 = *(long *)((long)strings + (N & 0xfffffffffffffffe) * 4);
      if (lVar4 != 0) {
        if (*(byte *)(lVar4 + depth) == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)*(byte *)(lVar4 + depth) << 0x18;
          bVar1 = *(byte *)(lVar4 + 1 + depth);
          if (bVar1 != 0) {
            uVar5 = uVar5 | (uint)bVar1 << 0x10;
            cVar2 = *(char *)(lVar4 + 2 + depth);
            if (cVar2 != '\0') {
              uVar5 = uVar5 | CONCAT11(cVar2,*(undefined1 *)(lVar4 + 3 + depth));
            }
          }
        }
        puVar3 = strings[N - 1];
        if (puVar3 != (uchar *)0x0) {
          if (puVar3[depth] == 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = (uint)puVar3[depth] << 0x18;
            if (puVar3[depth + 1] != 0) {
              uVar9 = uVar9 | (uint)puVar3[depth + 1] << 0x10;
              if (puVar3[depth + 2] != '\0') {
                uVar9 = uVar9 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
              }
            }
          }
LAB_00217533:
          uVar6 = uVar8;
          if (((uVar8 != uVar5) && (uVar6 = uVar9, uVar9 != uVar8)) && (uVar9 != uVar5)) {
            uVar6 = uVar5;
            if (uVar8 < uVar5) {
              if ((uVar9 <= uVar5) && (uVar6 = uVar9, uVar9 < uVar8)) {
                uVar6 = uVar8;
              }
            }
            else if ((uVar5 <= uVar9) && (uVar6 = uVar9, uVar8 < uVar9)) {
              uVar6 = uVar8;
            }
          }
          return uVar6;
        }
      }
    }
  }
  else if (puVar3 != (uchar *)0x0) {
    if (puVar3[depth] == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (uint)puVar3[depth] << 0x18;
      if (puVar3[depth + 1] != 0) {
        uVar5 = uVar5 | (uint)puVar3[depth + 1] << 0x10;
        if (puVar3[depth + 2] != '\0') {
          uVar5 = uVar5 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
        }
      }
    }
    puVar3 = strings[1];
    if (puVar3 != (uchar *)0x0) {
      if (puVar3[depth] == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (uint)puVar3[depth] << 0x18;
        if (puVar3[depth + 1] != 0) {
          uVar9 = uVar9 | (uint)puVar3[depth + 1] << 0x10;
          if (puVar3[depth + 2] != '\0') {
            uVar9 = uVar9 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
          }
        }
      }
      puVar3 = strings[2];
      if (puVar3 != (uchar *)0x0) {
        if (puVar3[depth] == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (uint)puVar3[depth] << 0x18;
          if (puVar3[depth + 1] != 0) {
            uVar6 = uVar6 | (uint)puVar3[depth + 1] << 0x10;
            if (puVar3[depth + 2] != '\0') {
              uVar6 = uVar6 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
            }
          }
        }
        uVar8 = uVar5;
        if (((uVar5 != uVar9) && (uVar8 = uVar6, uVar6 != uVar5)) && (uVar6 != uVar9)) {
          uVar8 = uVar9;
          if (uVar5 < uVar9) {
            if ((uVar6 <= uVar9) && (uVar8 = uVar6, uVar6 < uVar5)) {
              uVar8 = uVar5;
            }
          }
          else if ((uVar9 <= uVar6) && (uVar8 = uVar6, uVar5 < uVar6)) {
            uVar8 = uVar5;
          }
        }
        uVar11 = N >> 1;
        puVar3 = strings[uVar11];
        if (puVar3 != (uchar *)0x0) {
          if (puVar3[depth] == 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = (uint)puVar3[depth] << 0x18;
            if (puVar3[depth + 1] != 0) {
              uVar9 = uVar9 | (uint)puVar3[depth + 1] << 0x10;
              if (puVar3[depth + 2] != '\0') {
                uVar9 = uVar9 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
              }
            }
          }
          puVar3 = strings[uVar11 + 1];
          if (puVar3 != (uchar *)0x0) {
            if (puVar3[depth] == 0) {
              uVar6 = 0;
            }
            else {
              uVar6 = (uint)puVar3[depth] << 0x18;
              if (puVar3[depth + 1] != 0) {
                uVar6 = uVar6 | (uint)puVar3[depth + 1] << 0x10;
                if (puVar3[depth + 2] != '\0') {
                  uVar6 = uVar6 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
                }
              }
            }
            puVar3 = strings[uVar11 + 2];
            if (puVar3 != (uchar *)0x0) {
              if (puVar3[depth] == 0) {
                uVar10 = 0;
              }
              else {
                uVar10 = (uint)puVar3[depth] << 0x18;
                if (puVar3[depth + 1] != 0) {
                  uVar10 = uVar10 | (uint)puVar3[depth + 1] << 0x10;
                  if (puVar3[depth + 2] != '\0') {
                    uVar10 = uVar10 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
                  }
                }
              }
              uVar5 = uVar9;
              if (((uVar9 != uVar6) && (uVar5 = uVar10, uVar10 != uVar9)) && (uVar10 != uVar6)) {
                uVar5 = uVar6;
                if (uVar9 < uVar6) {
                  if ((uVar10 <= uVar6) && (uVar5 = uVar10, uVar10 < uVar9)) {
                    uVar5 = uVar9;
                  }
                }
                else if ((uVar6 <= uVar10) && (uVar5 = uVar10, uVar9 < uVar10)) {
                  uVar5 = uVar9;
                }
              }
              puVar3 = strings[N - 3];
              if (puVar3 != (uchar *)0x0) {
                if (puVar3[depth] == 0) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = (uint)puVar3[depth] << 0x18;
                  if (puVar3[depth + 1] != 0) {
                    uVar6 = uVar6 | (uint)puVar3[depth + 1] << 0x10;
                    if (puVar3[depth + 2] != '\0') {
                      uVar6 = uVar6 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
                    }
                  }
                }
                puVar3 = strings[N - 2];
                if (puVar3 != (uchar *)0x0) {
                  if (puVar3[depth] == 0) {
                    uVar10 = 0;
                  }
                  else {
                    uVar10 = (uint)puVar3[depth] << 0x18;
                    if (puVar3[depth + 1] != 0) {
                      uVar10 = uVar10 | (uint)puVar3[depth + 1] << 0x10;
                      if (puVar3[depth + 2] != '\0') {
                        uVar10 = uVar10 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
                      }
                    }
                  }
                  puVar3 = strings[N - 1];
                  if (puVar3 != (uchar *)0x0) {
                    if (puVar3[depth] == 0) {
                      uVar7 = 0;
                    }
                    else {
                      uVar7 = (uint)puVar3[depth] << 0x18;
                      if (puVar3[depth + 1] != 0) {
                        uVar7 = uVar7 | (uint)puVar3[depth + 1] << 0x10;
                        if (puVar3[depth + 2] != '\0') {
                          uVar7 = uVar7 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
                        }
                      }
                    }
                    uVar9 = uVar6;
                    if (((uVar6 != uVar10) && (uVar9 = uVar7, uVar7 != uVar6)) && (uVar7 != uVar10))
                    {
                      uVar9 = uVar10;
                      if (uVar6 < uVar10) {
                        if ((uVar7 <= uVar10) && (uVar9 = uVar7, uVar7 < uVar6)) {
                          uVar9 = uVar6;
                        }
                      }
                      else if ((uVar10 <= uVar7) && (uVar9 = uVar7, uVar6 < uVar7)) {
                        uVar9 = uVar6;
                      }
                    }
                    goto LAB_00217533;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x38,"uint32_t get_char(unsigned char *, size_t)");
}

Assistant:

CharT
pseudo_median(unsigned char** strings, size_t N, size_t depth)
{
	if (N > 30)
		return med3char(
			med3char(
				get_char<CharT>(strings[0], depth),
				get_char<CharT>(strings[1], depth),
				get_char<CharT>(strings[2], depth)
				),
			med3char(
				get_char<CharT>(strings[N/2  ], depth),
				get_char<CharT>(strings[N/2+1], depth),
				get_char<CharT>(strings[N/2+2], depth)
				),
			med3char(
				get_char<CharT>(strings[N-3], depth),
				get_char<CharT>(strings[N-2], depth),
				get_char<CharT>(strings[N-1], depth)
				)
		       );
	else
		return med3char(get_char<CharT>(strings[0  ], depth),
				get_char<CharT>(strings[N/2], depth),
				get_char<CharT>(strings[N-1], depth));
}